

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bgp_rib.cpp
# Opt level: O0

bool best_path_selection_battle
               (bgp_peer *my_peer,node<adj_ribs_in_data> *me,node<loc_rib_data> *opponent)

{
  node<loc_rib_data> *opponent_local;
  node<adj_ribs_in_data> *me_local;
  bgp_peer *my_peer_local;
  
  if ((me->data->path_attr).local_pref == opponent->data->path_attr->local_pref) {
    if ((me->data->path_attr).as_path_length == opponent->data->path_attr->as_path_length) {
      if ((me->data->path_attr).origin == opponent->data->path_attr->origin) {
        if ((me->data->path_attr).med == opponent->data->path_attr->med) {
          if (my_peer->bgp_id == opponent->data->peer->bgp_id) {
            my_peer_local._7_1_ = true;
          }
          else if (my_peer->bgp_id < opponent->data->peer->bgp_id) {
            my_peer_local._7_1_ = true;
          }
          else {
            my_peer_local._7_1_ = false;
          }
        }
        else if ((me->data->path_attr).med < opponent->data->path_attr->med) {
          my_peer_local._7_1_ = true;
        }
        else {
          my_peer_local._7_1_ = false;
        }
      }
      else if ((me->data->path_attr).origin < opponent->data->path_attr->origin) {
        my_peer_local._7_1_ = true;
      }
      else {
        my_peer_local._7_1_ = false;
      }
    }
    else if ((me->data->path_attr).as_path_length < opponent->data->path_attr->as_path_length) {
      my_peer_local._7_1_ = true;
    }
    else {
      my_peer_local._7_1_ = false;
    }
  }
  else if (opponent->data->path_attr->local_pref < (me->data->path_attr).local_pref) {
    my_peer_local._7_1_ = true;
  }
  else {
    my_peer_local._7_1_ = false;
  }
  return my_peer_local._7_1_;
}

Assistant:

bool best_path_selection_battle(bgp_peer* my_peer, node<adj_ribs_in_data>* me, node<loc_rib_data>* opponent){ // TODO 古い自分のピアとの経路との対決でエラーになりそう
    if(me->data->path_attr.local_pref != opponent->data->path_attr->local_pref){
        if(me->data->path_attr.local_pref > opponent->data->path_attr->local_pref){
            return true;
        }
        return false;
    }
    if(me->data->path_attr.as_path_length != opponent->data->path_attr->as_path_length){
        if(me->data->path_attr.as_path_length < opponent->data->path_attr->as_path_length){
            return true;
        }
        return false;
    }
    if(me->data->path_attr.origin != opponent->data->path_attr->origin){
        if(me->data->path_attr.origin < opponent->data->path_attr->origin){
            return true;
        }
        return false;
    }
    if(me->data->path_attr.med != opponent->data->path_attr->med){
        if(me->data->path_attr.med < opponent->data->path_attr->med){
            return true;
        }
        return false;
    }
    if(my_peer->bgp_id != opponent->data->peer->bgp_id){
        if(my_peer->bgp_id < opponent->data->peer->bgp_id){
            return true;
        }
        return false;
    }
    return true;
}